

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<unsigned_char,unsigned_long>(void)

{
  uchar ret;
  uchar local_2b [3];
  unsigned_long local_28;
  
  local_2b[0] = '\0';
  local_28 = 0;
  local_2b[1] = 0;
  MultiplicationHelper<unsigned_char,unsigned_long,8>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_2b,&local_28,local_2b + 1);
  local_28 = 0;
  local_2b[1] = 0;
  local_2b[2] = local_2b[0];
  MultiplicationHelper<unsigned_char,unsigned_long,8>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_2b + 2,&local_28,local_2b + 1);
  local_28 = 0;
  MultiplicationHelper<unsigned_char,unsigned_long,8>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_2b,&local_28,local_2b);
  local_28 = 0;
  MultiplicationHelper<unsigned_char,unsigned_long,8>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_2b,&local_28,local_2b);
  local_2b[0] = '\x01';
  operator/(1,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x1);
  if ((local_2b[0] != 0xff) && (local_2b[0] = local_2b[0] + '\x01', local_2b[0] != 0xff)) {
    local_2b[0] = '\0';
    operator-(0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 )0x0);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}